

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.hpp
# Opt level: O0

uint alphabet_chars_per_word<unsigned_long>(uint bits_per_char)

{
  uint bits_per_word;
  uint bits_per_char_local;
  
  return 0x40 / bits_per_char;
}

Assistant:

unsigned int alphabet_chars_per_word(unsigned int bits_per_char) {
    unsigned int bits_per_word = sizeof(word_t)*8;
    // TODO: this is currently a "work-around": if the type is signed, we
    //       can't use the msb, thus we need to subtract one
    if (std::is_signed<word_t>::value)
        --bits_per_word;
    return bits_per_word/bits_per_char;
}